

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-pending-instances.c
# Opt level: O2

int run_test_pipe_pending_instances(void)

{
  int iVar1;
  uv_loop_t *loop;
  char *pcVar2;
  char *pcVar3;
  undefined8 uVar4;
  int64_t eval_b;
  int64_t eval_a;
  uv_pipe_t pipe_handle;
  
  loop = uv_default_loop();
  iVar1 = uv_pipe_init(loop,&pipe_handle,0);
  eval_a = (int64_t)iVar1;
  eval_b = 0;
  if (eval_a == 0) {
    uv_pipe_pending_instances(&pipe_handle,8);
    iVar1 = uv_pipe_bind(&pipe_handle,"/tmp/uv-test-sock");
    eval_a = (int64_t)iVar1;
    eval_b = 0;
    if (eval_a == 0) {
      uv_pipe_pending_instances(&pipe_handle,0x10);
      iVar1 = uv_listen((uv_stream_t *)&pipe_handle,0x80,connection_cb);
      eval_a = (int64_t)iVar1;
      eval_b = 0;
      if (eval_a == 0) {
        uv_close((uv_handle_t *)&pipe_handle,(uv_close_cb)0x0);
        iVar1 = uv_run(loop,UV_RUN_DEFAULT);
        eval_a = (int64_t)iVar1;
        eval_b = 0;
        if (eval_a == 0) {
          uv_walk(loop,close_walk_cb,(void *)0x0);
          uv_run(loop,UV_RUN_DEFAULT);
          eval_a = 0;
          iVar1 = uv_loop_close(loop);
          eval_b = (int64_t)iVar1;
          if (eval_b == 0) {
            uv_library_shutdown();
            return 0;
          }
          pcVar3 = "uv_loop_close(loop)";
          pcVar2 = "0";
          uVar4 = 0x39;
        }
        else {
          pcVar3 = "0";
          pcVar2 = "r";
          uVar4 = 0x37;
        }
      }
      else {
        pcVar3 = "0";
        pcVar2 = "r";
        uVar4 = 0x32;
      }
    }
    else {
      pcVar3 = "0";
      pcVar2 = "r";
      uVar4 = 0x2d;
    }
  }
  else {
    pcVar3 = "0";
    pcVar2 = "r";
    uVar4 = 0x28;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-pending-instances.c"
          ,uVar4,pcVar2,"==",pcVar3,eval_a,"==",eval_b);
  abort();
}

Assistant:

TEST_IMPL(pipe_pending_instances) {
  int r;
  uv_pipe_t pipe_handle;
  uv_loop_t* loop;

  loop = uv_default_loop();

  r = uv_pipe_init(loop, &pipe_handle, 0);
  ASSERT_OK(r);

  uv_pipe_pending_instances(&pipe_handle, 8);

  r = uv_pipe_bind(&pipe_handle, TEST_PIPENAME);
  ASSERT_OK(r);

  uv_pipe_pending_instances(&pipe_handle, 16);

  r = uv_listen((uv_stream_t*)&pipe_handle, 128, connection_cb);
  ASSERT_OK(r);

  uv_close((uv_handle_t*)&pipe_handle, NULL);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT_OK(r);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}